

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::RandCaseStatement::serializeTo(RandCaseStatement *this,ASTSerializer *serializer)

{
  long lVar1;
  Item *item;
  pointer pIVar2;
  string_view name;
  
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  pIVar2 = (this->items)._M_ptr;
  for (lVar1 = (this->items)._M_extent._M_extent_value << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    ASTSerializer::startObject(serializer);
    ASTSerializer::write(serializer,4,"expr",(size_t)(pIVar2->expr).ptr);
    ASTSerializer::write(serializer,4,"stmt",(size_t)(pIVar2->stmt).ptr);
    ASTSerializer::endObject(serializer);
    pIVar2 = pIVar2 + 1;
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void RandCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto& item : items) {
        serializer.startObject();
        serializer.write("expr", *item.expr);
        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();
}